

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O0

handler_id_type __thiscall
handlebars::dispatcher<signals,std::__cxx11::string_const&>::
connect_member<logger*,void(logger::*)(std::__cxx11::string_const&)>
          (dispatcher<signals,std::__cxx11::string_const&> *this,signals *signal,logger **object,
          offset_in_logger_to_subr member)

{
  undefined4 uVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  reference pvVar4;
  vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
  *pvVar5;
  mapped_type *pmVar6;
  handler_id_type hVar7;
  undefined4 uStack_84;
  __normal_iterator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_*,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>
  local_70;
  __normal_iterator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_*,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>
  local_68;
  const_iterator local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  value_type local_50;
  logger **local_48;
  offset_in_logger_to_subr member_local;
  logger **local_38;
  logger **object_local;
  signals *signal_local;
  offset_in_logger_to_subr local_20;
  ulong local_18;
  handler_id_type handler_id;
  
  local_48 = object;
  member_local = member;
  local_38 = (logger **)signal;
  object_local = (logger **)this;
  signal_local = (signals *)object;
  local_20 = member;
  pmVar2 = std::
           unordered_map<signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<signals>,_std::equal_to<signals>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::operator[](&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                         ::m_unused_handler_storage_indices,(key_type *)this);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pmVar2);
  if (sVar3 == 0) {
    uVar1 = *(undefined4 *)object_local;
    pmVar6 = std::
             unordered_map<signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>,_std::hash<signals>,_std::equal_to<signals>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>_>
             ::operator[](&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           ::m_handler_map,(key_type *)object_local);
    handler_id._0_8_ =
         std::
         vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>
         ::size(pmVar6);
    local_18 = CONCAT44(uStack_84,uVar1);
    pvVar5 = (vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
              *)std::
                unordered_map<signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>,_std::hash<signals>,_std::equal_to<signals>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>_>
                ::operator[](&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ::m_handler_map,(key_type *)object_local);
    std::
    vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
    ::emplace_back<std::in_place_t_const&,logger*,void(logger::*&)(std::__cxx11::string_const&)>
              (pvVar5,(in_place_t *)&std::in_place,local_38,(offset_in_logger_to_subr *)&local_48);
  }
  else {
    local_58 = *(undefined4 *)object_local;
    pmVar2 = std::
             unordered_map<signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<signals>,_std::equal_to<signals>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           ::m_unused_handler_storage_indices,(key_type *)object_local);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pmVar2);
    local_50 = *pvVar4;
    local_18 = CONCAT44(uStack_54,local_58);
    handler_id._0_8_ = local_50;
    pmVar2 = std::
             unordered_map<signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<signals>,_std::equal_to<signals>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           ::m_unused_handler_storage_indices,(key_type *)object_local);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(pmVar2);
    pvVar5 = (vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
              *)std::
                unordered_map<signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>,_std::hash<signals>,_std::equal_to<signals>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>_>
                ::operator[](&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ::m_handler_map,(key_type *)object_local);
    pmVar6 = std::
             unordered_map<signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>,_std::hash<signals>,_std::equal_to<signals>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>_>
             ::operator[](&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           ::m_handler_map,(key_type *)object_local);
    local_70._M_current =
         (optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>
          *)std::
            vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>
            ::begin(pmVar6);
    local_68 = __gnu_cxx::
               __normal_iterator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_*,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>
               ::operator+(&local_70,handler_id._0_8_);
    __gnu_cxx::
    __normal_iterator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>const*,std::vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>>
    ::__normal_iterator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>*>
              ((__normal_iterator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>const*,std::vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>>
                *)&local_60,&local_68);
    std::
    vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
    ::emplace<std::in_place_t_const&,logger*,void(logger::*&)(std::__cxx11::string_const&)>
              (pvVar5,local_60,(in_place_t *)&std::in_place,local_38,
               (offset_in_logger_to_subr *)&local_48);
  }
  hVar7._0_8_ = local_18 & 0xffffffff;
  hVar7.index = handler_id._0_8_;
  return hVar7;
}

Assistant:

typename dispatcher<SignalT, HandlerArgTs...>::handler_id_type
				dispatcher<SignalT, HandlerArgTs...>::connect_member(const SignalT& signal, ClassT&& object, MemPtrT member)
		{
				handler_id_type handler_id;
				if (m_unused_handler_storage_indices[signal].size() > 0) {
						handler_id = { signal, m_unused_handler_storage_indices[signal].back() };
						m_unused_handler_storage_indices[signal].pop_back();
						m_handler_map[signal].emplace(
								m_handler_map[signal].begin() + handler_id.index, std::in_place, std::forward<ClassT>(object), member);
				}
				else {
						handler_id = { signal, m_handler_map[signal].size() };
						m_handler_map[signal].emplace_back(std::in_place, std::forward<ClassT>(object), member);
				}
				return handler_id;
		}